

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O1

FIOBJ fiobj_hash_remove2(FIOBJ hash,uint64_t hash_value)

{
  int *piVar1;
  byte bVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 *unaff_R15;
  bool bVar15;
  
  if (((uint)hash & 7) != 4) {
    __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0x106,"FIOBJ fiobj_hash_remove2(FIOBJ, uint64_t)");
  }
  uVar9 = hash & 0xfffffffffffffff8;
  if (*(long *)(uVar9 + 0x28) != 0) {
    uVar14 = -(ulong)(hash_value == 0) | hash_value;
    if ((*(char *)(uVar9 + 0x30) != '\0') && (*(long *)(uVar9 + 0x18) != *(long *)(uVar9 + 8))) {
      fio_hash___rehash((fio_hash___s *)(uVar9 + 8));
    }
    bVar2 = *(byte *)(uVar9 + 0x31);
    bVar10 = false;
    uVar8 = 0;
    if (bVar2 != 0) {
      uVar8 = uVar14;
    }
    uVar5 = ~(-1L << (bVar2 & 0x3f));
    uVar8 = uVar8 ^ (uVar14 >> (bVar2 & 0x3f) | uVar14 << 0x40 - (bVar2 & 0x3f));
    lVar6 = *(long *)(uVar9 + 0x28);
    lVar11 = (uVar8 & uVar5) * 0x10;
    uVar12 = *(ulong *)(lVar6 + lVar11);
    if (uVar12 == uVar14 || uVar12 == 0) {
      unaff_R15 = (undefined8 *)(lVar6 + lVar11);
    }
    else {
      uVar12 = 0x420;
      if (*(ulong *)(uVar9 + 0x10) < 0x181) {
        uVar12 = (*(ulong *)(uVar9 + 0x10) >> 2) * 0xb;
      }
      if (uVar12 == 0) {
        bVar10 = true;
      }
      else {
        uVar13 = 0xb;
        do {
          lVar11 = (uVar8 + uVar13 & uVar5) * 0x10;
          unaff_R15 = (undefined8 *)(lVar6 + lVar11);
          uVar3 = *(ulong *)(lVar6 + lVar11);
          bVar10 = uVar3 != uVar14 && uVar3 != 0;
          if (uVar3 == uVar14 || uVar3 == 0) break;
          bVar15 = uVar13 < uVar12;
          uVar13 = uVar13 + 0xb;
        } while (bVar15);
      }
    }
    if (!bVar10) goto LAB_00142572;
  }
  unaff_R15 = (undefined8 *)0x0;
LAB_00142572:
  if ((unaff_R15 == (undefined8 *)0x0) || (unaff_R15[1] == 0)) {
    uVar14 = 0;
  }
  else {
    uVar14 = *(ulong *)(unaff_R15[1] + 0x10);
    if ((((~(uint)uVar14 & 6) != 0) && (uVar14 != 0)) && ((uVar14 & 1) == 0)) {
      LOCK();
      piVar1 = (int *)((uVar14 & 0xfffffffffffffff8) + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    fiobj_free(*(FIOBJ *)(unaff_R15[1] + 8));
    lVar6 = unaff_R15[1];
    *(undefined8 *)(lVar6 + 8) = 0;
    fiobj_free(*(FIOBJ *)(lVar6 + 0x10));
    puVar4 = (undefined8 *)unaff_R15[1];
    puVar4[2] = 0;
    *(long *)(uVar9 + 8) = *(long *)(uVar9 + 8) + -1;
    *puVar4 = 0;
    lVar6 = *(long *)(uVar9 + 0x18);
    lVar11 = *(long *)(uVar9 + 0x20);
    if (puVar4 == (undefined8 *)(lVar11 + lVar6 * 0x18 + -0x18)) {
      *unaff_R15 = 0;
      plVar7 = (long *)(lVar11 + lVar6 * 0x18 + -0x30);
      do {
        if (lVar6 == 1) {
          lVar6 = 0;
          break;
        }
        lVar6 = lVar6 + -1;
        lVar11 = *plVar7;
        plVar7 = plVar7 + -3;
      } while (lVar11 == 0);
      *(long *)(uVar9 + 0x18) = lVar6;
    }
    unaff_R15[1] = 0;
  }
  return uVar14;
}

Assistant:

FIOBJ fiobj_hash_remove2(FIOBJ hash, uint64_t hash_value) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old = FIOBJ_INVALID;
  fio_hash___remove(&obj2hash(hash)->hash, hash_value, -1, &old);
  return old;
}